

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber *
decQuantizeOp(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint8_t quant,
             uint32_t *status)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint32_t *puVar10;
  int iVar11;
  int32_t iVar12;
  int iVar13;
  int32_t residue;
  decContext workset;
  int32_t local_6c;
  uint32_t *local_68;
  decNumber *local_60;
  decContext local_58;
  
  iVar2 = set->digits;
  local_6c = 0;
  bVar1 = lhs->bits;
  bVar5 = rhs->bits | bVar1;
  if ((bVar5 & 0x70) == 0) {
    iVar3 = set->emin;
    if (quant == '\0') {
      local_60 = res;
      iVar11 = decGetInt(rhs);
      res = local_60;
    }
    else {
      iVar11 = rhs->exponent;
    }
    if ((((3 < iVar11 + 0x80000000U) || (iVar11 + 0x80000000U == 1)) &&
        ((iVar3 - iVar2) + 1 <= iVar11)) && (iVar11 <= set->emax)) {
      iVar3 = lhs->digits;
      local_68 = status;
      if ((lhs->lsu[0] == '\0') && ((bVar1 & 0x70) == 0 && iVar3 == 1)) {
        uprv_decNumberCopy_63(res,lhs);
        res->exponent = iVar11;
        iVar13 = iVar11;
      }
      else {
        iVar4 = lhs->exponent;
        iVar13 = iVar11 - iVar4;
        if (iVar2 < iVar3 - iVar13) goto LAB_00253dd1;
        if (iVar13 < 1) {
          uprv_decNumberCopy_63(res,lhs);
          if (iVar13 < 0) {
            iVar12 = decShiftToMost(res->lsu,res->digits,-iVar13);
            res->digits = iVar12;
            iVar13 = iVar13 + res->exponent;
            res->exponent = iVar13;
          }
          else {
            iVar13 = res->exponent;
          }
        }
        else {
          uVar6 = set->emax;
          uVar7 = set->emin;
          uVar8 = set->round;
          uVar9 = set->traps;
          local_58.status = set->status;
          local_58.clamp = set->clamp;
          local_58._25_3_ = *(undefined3 *)&set->field_0x19;
          local_58.emax = uVar6;
          local_58.digits = iVar3 - iVar13;
          res->bits = bVar1;
          res->exponent = iVar4;
          local_58.emin = uVar7;
          local_58.round = uVar8;
          local_58.traps = uVar9;
          decSetCoeff(res,&local_58,lhs->lsu,iVar3,&local_6c,status);
          decApplyRound(res,&local_58,local_6c,status);
          local_6c = 0;
          iVar13 = res->exponent;
          if (iVar11 < iVar13) {
            if (res->digits == iVar2) {
              *local_68 = *local_68 & 0xfffff75f | 0x80;
              return res;
            }
            iVar12 = decShiftToMost(res->lsu,res->digits,1);
            res->digits = iVar12;
            iVar13 = res->exponent + -1;
            res->exponent = iVar13;
          }
        }
      }
      puVar10 = local_68;
      if ((set->emax - res->digits) + 1 < iVar13) {
        *(byte *)local_68 = (byte)*local_68 | 0x80;
        return res;
      }
      decFinalize(res,set,&local_6c,local_68);
      *(byte *)((long)puVar10 + 1) = *(byte *)((long)puVar10 + 1) & 0xdf;
      return res;
    }
  }
  else {
    if ((bVar5 & 0x30) != 0) {
      decNaNs(res,lhs,rhs,set,status);
      return res;
    }
    if (((rhs->bits ^ bVar1) & 0x40) == 0) {
      uprv_decNumberCopy_63(res,lhs);
      return res;
    }
  }
LAB_00253dd1:
  *(byte *)status = (byte)*status | 0x80;
  return res;
}

Assistant:

static decNumber * decQuantizeOp(decNumber *res, const decNumber *lhs,
                                 const decNumber *rhs, decContext *set,
                                 Flag quant, uInt *status) {
  #if DECSUBSET
  decNumber *alloclhs=NULL;        /* non-NULL if rounded lhs allocated  */
  decNumber *allocrhs=NULL;        /* .., rhs  */
  #endif
  const decNumber *inrhs=rhs;      /* save original rhs  */
  Int   reqdigits=set->digits;     /* requested DIGITS  */
  Int   reqexp;                    /* requested exponent [-scale]  */
  Int   residue=0;                 /* rounding residue  */
  Int   etiny=set->emin-(reqdigits-1);

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  do {                             /* protect allocated storage  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operands and set lostDigits status, as needed  */
      if (lhs->digits>reqdigits) {
        alloclhs=decRoundOperand(lhs, set, status);
        if (alloclhs==NULL) break;
        lhs=alloclhs;
        }
      if (rhs->digits>reqdigits) { /* [this only checks lostDigits]  */
        allocrhs=decRoundOperand(rhs, set, status);
        if (allocrhs==NULL) break;
        rhs=allocrhs;
        }
      }
    #endif
    /* [following code does not require input rounding]  */

    /* Handle special values  */
    if (SPECIALARGS) {
      /* NaNs get usual processing  */
      if (SPECIALARGS & (DECSNAN | DECNAN))
        decNaNs(res, lhs, rhs, set, status);
      /* one infinity but not both is bad  */
      else if ((lhs->bits ^ rhs->bits) & DECINF)
        *status|=DEC_Invalid_operation;
      /* both infinity: return lhs  */
      else uprv_decNumberCopy(res, lhs);          /* [nop if in place]  */
      break;
      }

    /* set requested exponent  */
    if (quant) reqexp=inrhs->exponent;  /* quantize -- match exponents  */
     else {                             /* rescale -- use value of rhs  */
      /* Original rhs must be an integer that fits and is in range,  */
      /* which could be from -1999999997 to +999999999, thanks to  */
      /* subnormals  */
      reqexp=decGetInt(inrhs);               /* [cannot fail]  */
      }

    #if DECSUBSET
    if (!set->extended) etiny=set->emin;     /* no subnormals  */
    #endif

    if (reqexp==BADINT                       /* bad (rescale only) or ..  */
     || reqexp==BIGODD || reqexp==BIGEVEN    /* very big (ditto) or ..  */
     || (reqexp<etiny)                       /* < lowest  */
     || (reqexp>set->emax)) {                /* > emax  */
      *status|=DEC_Invalid_operation;
      break;}

    /* the RHS has been processed, so it can be overwritten now if necessary  */
    if (ISZERO(lhs)) {                       /* zero coefficient unchanged  */
      uprv_decNumberCopy(res, lhs);               /* [nop if in place]  */
      res->exponent=reqexp;                  /* .. just set exponent  */
      #if DECSUBSET
      if (!set->extended) res->bits=0;       /* subset specification; no -0  */
      #endif
      }
     else {                                  /* non-zero lhs  */
      Int adjust=reqexp-lhs->exponent;       /* digit adjustment needed  */
      /* if adjusted coefficient will definitely not fit, give up now  */
      if ((lhs->digits-adjust)>reqdigits) {
        *status|=DEC_Invalid_operation;
        break;
        }

      if (adjust>0) {                        /* increasing exponent  */
        /* this will decrease the length of the coefficient by adjust  */
        /* digits, and must round as it does so  */
        decContext workset;                  /* work  */
        workset=*set;                        /* clone rounding, etc.  */
        workset.digits=lhs->digits-adjust;   /* set requested length  */
        /* [note that the latter can be <1, here]  */
        decCopyFit(res, lhs, &workset, &residue, status); /* fit to result  */
        decApplyRound(res, &workset, residue, status);    /* .. and round  */
        residue=0;                                        /* [used]  */
        /* If just rounded a 999s case, exponent will be off by one;  */
        /* adjust back (after checking space), if so.  */
        if (res->exponent>reqexp) {
          /* re-check needed, e.g., for quantize(0.9999, 0.001) under  */
          /* set->digits==3  */
          if (res->digits==reqdigits) {      /* cannot shift by 1  */
            *status&=~(DEC_Inexact | DEC_Rounded); /* [clean these]  */
            *status|=DEC_Invalid_operation;
            break;
            }
          res->digits=decShiftToMost(res->lsu, res->digits, 1); /* shift  */
          res->exponent--;                   /* (re)adjust the exponent.  */
          }
        #if DECSUBSET
        if (ISZERO(res) && !set->extended) res->bits=0; /* subset; no -0  */
        #endif
        } /* increase  */
       else /* adjust<=0 */ {                /* decreasing or = exponent  */
        /* this will increase the length of the coefficient by -adjust  */
        /* digits, by adding zero or more trailing zeros; this is  */
        /* already checked for fit, above  */
        uprv_decNumberCopy(res, lhs);             /* [it will fit]  */
        /* if padding needed (adjust<0), add it now...  */
        if (adjust<0) {
          res->digits=decShiftToMost(res->lsu, res->digits, -adjust);
          res->exponent+=adjust;             /* adjust the exponent  */
          }
        } /* decrease  */
      } /* non-zero  */

    /* Check for overflow [do not use Finalize in this case, as an  */
    /* overflow here is a "don't fit" situation]  */
    if (res->exponent>set->emax-res->digits+1) {  /* too big  */
      *status|=DEC_Invalid_operation;
      break;
      }
     else {
      decFinalize(res, set, &residue, status);    /* set subnormal flags  */
      *status&=~DEC_Underflow;          /* suppress Underflow [as per 754]  */
      }
    } while(0);                         /* end protected  */

  #if DECSUBSET
  if (allocrhs!=NULL) free(allocrhs);   /* drop any storage used  */
  if (alloclhs!=NULL) free(alloclhs);   /* ..  */
  #endif
  return res;
  }